

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_buf.c
# Opt level: O3

int nghttp2_bufs_orb_hold(nghttp2_bufs *bufs,uint8_t b)

{
  int iVar1;
  byte *pbVar2;
  
  pbVar2 = (bufs->cur->buf).last;
  if ((bufs->cur->buf).end == pbVar2) {
    iVar1 = bufs_alloc_chain(bufs);
    if (iVar1 != 0) {
      return iVar1;
    }
    pbVar2 = (bufs->cur->buf).last;
  }
  *pbVar2 = *pbVar2 | b;
  return 0;
}

Assistant:

int nghttp2_bufs_orb_hold(nghttp2_bufs *bufs, uint8_t b) {
  int rv;

  rv = bufs_ensure_addb(bufs);
  if (rv != 0) {
    return rv;
  }

  *bufs->cur->buf.last |= b;

  return 0;
}